

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strfuncs.c
# Opt level: O2

int32 nextword(char *line,char *delim,char **word,char *delimfound)

{
  char cVar1;
  char cVar2;
  char *w;
  char *pcVar3;
  
  do {
    pcVar3 = delim;
    if (*line == '\0') {
      return -1;
    }
    do {
      cVar1 = *pcVar3;
      if (cVar1 == '\0') {
        *word = line;
        goto LAB_0010a8db;
      }
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != *line);
    line = line + 1;
  } while( true );
LAB_0010a8db:
  cVar1 = line[1];
  line = line + 1;
  pcVar3 = delim;
  if (cVar1 == '\0') {
LAB_0010a8f8:
    *delimfound = cVar1;
    *line = '\0';
    return (int)line - *(int *)word;
  }
  while (cVar2 = *pcVar3, cVar2 != '\0') {
    pcVar3 = pcVar3 + 1;
    if (cVar2 == cVar1) goto LAB_0010a8f8;
  }
  goto LAB_0010a8db;
}

Assistant:

int32
nextword(char *line, const char *delim, char **word, char *delimfound)
{
    const char *d;
    char *w;

    /* Skip past any preceding delimiters */
    for (w = line; *w; w++) {
        for (d = delim; *d && (*d != *w); d++);
        if (!*d)
            break;
    }
    if (!*w)
        return -1;

    *word = w;                  /* Beginning of word */

    /* Skip until first delimiter char */
    for (w++; *w; w++) {
        for (d = delim; *d && (*d != *w); d++);
        if (*d)
            break;
    }

    /* Replace delimiter with NULL char, but return the original first */
    *delimfound = *w;
    *w = '\0';

    return (w - *word);
}